

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O2

void chrono::utils::parseADMJoint
               (string *ID,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tokens,ChSystem *sys)

{
  __type_conflict _Var1;
  string *psVar2;
  pointer ppVar3;
  allocator local_69;
  string *local_68;
  mapped_type *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_joint_struct>_>_>
                           *)joints_map_abi_cxx11_,ID);
  ppVar3 = (tokens->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (string *)&local_60->marker_J;
  local_58 = (string *)&local_60->marker_I;
  do {
    if (ppVar3 == (tokens->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (ppVar3->first == 1) {
      std::__cxx11::string::string((string *)&local_50,"I",&local_69);
      _Var1 = std::operator==(&ppVar3->second,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      psVar2 = local_58;
      if (!_Var1) {
        std::__cxx11::string::string((string *)&local_50,"J",&local_69);
        _Var1 = std::operator==(&ppVar3->second,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        psVar2 = local_68;
        if (!_Var1) {
          std::__cxx11::string::_M_assign((string *)local_60);
          goto LAB_00e520a7;
        }
      }
      ppVar3 = ppVar3 + 1;
      std::__cxx11::string::_M_assign(psVar2);
    }
LAB_00e520a7:
    ppVar3 = ppVar3 + 1;
  } while( true );
}

Assistant:

void parseADMJoint(std::string ID, std::vector<std::pair<int, std::string>>& tokens, ChSystem& sys) {
    adams_joint_struct& joint = joints_map[ID];  // uses default contructor
    auto iter = tokens.begin();
    while (iter != tokens.end()) {
        // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;

        if (iter->first == LABEL) {
            if (iter->second == std::string("I")) {
                iter++;  // Get digit
                joint.marker_I = iter->second;
            } else if (iter->second == std::string("J")) {
                iter++;  // Get digit
                joint.marker_J = iter->second;
            } else {
                joint.type = iter->second;
                // std::cout << "type is " << joint.type <<std::endl;
            }
        }

        iter++;
    }
}